

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_kiss.c
# Opt level: O1

int csp_kiss_add_interface(csp_iface_t *iface)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = -2;
  if ((((iface != (csp_iface_t *)0x0) && (iface->name != (char *)0x0)) &&
      (plVar1 = (long *)iface->interface_data, plVar1 != (long *)0x0)) && (*plVar1 != 0)) {
    iVar2 = 0;
    plVar1[3] = 0;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    iface->nexthop = csp_kiss_tx;
    csp_iflist_add(iface);
  }
  return iVar2;
}

Assistant:

int csp_kiss_add_interface(csp_iface_t * iface) {

	if ((iface == NULL) || (iface->name == NULL) || (iface->interface_data == NULL)) {
		return CSP_ERR_INVAL;
	}

	csp_kiss_interface_data_t * ifdata = iface->interface_data;
	if (ifdata->tx_func == NULL) {
		return CSP_ERR_INVAL;
	}

	ifdata->rx_length = 0;
	ifdata->rx_mode = KISS_MODE_NOT_STARTED;
	ifdata->rx_first = false;
	ifdata->rx_packet = NULL;

	iface->nexthop = csp_kiss_tx;

	csp_iflist_add(iface);

	return CSP_ERR_NONE;
}